

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evenOdd.cpp
# Opt level: O1

int main(void)

{
  uint uVar1;
  undefined8 uVar2;
  long lVar3;
  _Alloc_hider _Var4;
  size_type *psVar5;
  ostream *poVar6;
  long *plVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int *piVar12;
  int *varToPopulate;
  int *piVar13;
  long lVar14;
  undefined8 uStack_250;
  int aiStack_248 [2];
  ostringstream local_240 [8];
  ostringstream promptStream;
  ios_base local_1d0 [264];
  string local_c8;
  string local_a8;
  undefined1 *local_88;
  int *local_80;
  size_type *local_78;
  string prompt_1;
  string prompt;
  int size;
  
  prompt_1.field_2._8_8_ = &prompt._M_string_length;
  uStack_250 = 0x1023d5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&prompt_1.field_2 + 8),"Please enter an array size: ","");
  uStack_250 = 0x1023f6;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,prompt_1.field_2._8_8_,
             prompt._M_dataplus._M_p + prompt_1.field_2._8_8_);
  uStack_250 = 0x102406;
  getInt((int *)(prompt.field_2._M_local_buf + 0xc),&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    uStack_250 = 0x102421;
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  lVar3 = -((ulong)(uint)prompt.field_2._12_4_ * 4 + 0xf & 0xfffffffffffffff0);
  varToPopulate = (int *)((long)aiStack_248 + lVar3);
  piVar12 = varToPopulate;
  piVar13 = aiStack_248;
  if (0 < (int)prompt.field_2._12_4_) {
    lVar14 = 0;
    local_88 = (undefined1 *)aiStack_248;
    local_80 = varToPopulate;
    do {
      local_78 = &prompt_1._M_string_length;
      *(undefined8 *)((long)aiStack_248 + lVar3 + -8) = 0x102482;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Please enter the value of element ","");
      *(undefined8 *)((long)aiStack_248 + lVar3 + -8) = 0x10248a;
      std::__cxx11::ostringstream::ostringstream(local_240);
      _Var4 = prompt_1._M_dataplus;
      psVar5 = local_78;
      *(undefined8 *)((long)aiStack_248 + lVar3 + -8) = 0x10249a;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_240,(char *)psVar5,(long)_Var4._M_p);
      *(undefined8 *)((long)aiStack_248 + lVar3 + -8) = 0x1024a5;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)lVar14);
      *(undefined8 *)((long)aiStack_248 + lVar3 + -8) = 0x1024b9;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
      *(undefined8 *)((long)aiStack_248 + lVar3 + -8) = 0x1024c8;
      std::__cxx11::stringbuf::str();
      *(undefined8 *)((long)aiStack_248 + lVar3 + -8) = 0x1024d3;
      getInt(varToPopulate,&local_a8);
      _Var4._M_p = local_a8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        uVar10 = local_a8.field_2._M_allocated_capacity + 1;
        *(undefined8 *)((long)aiStack_248 + lVar3 + -8) = 0x1024f5;
        operator_delete(_Var4._M_p,uVar10);
      }
      *(undefined8 *)((long)aiStack_248 + lVar3 + -8) = 0x102504;
      std::__cxx11::ostringstream::~ostringstream(local_240);
      *(undefined8 *)((long)aiStack_248 + lVar3 + -8) = 0x102510;
      std::ios_base::~ios_base(local_1d0);
      psVar5 = local_78;
      if (local_78 != &prompt_1._M_string_length) {
        uVar10 = prompt_1._M_string_length + 1;
        *(undefined8 *)((long)aiStack_248 + lVar3 + -8) = 0x102525;
        operator_delete(psVar5,uVar10);
      }
      lVar14 = lVar14 + 1;
      varToPopulate = varToPopulate + 1;
      piVar12 = local_80;
      piVar13 = (int *)local_88;
    } while (lVar14 < (int)prompt.field_2._12_4_);
  }
  if ((int)prompt.field_2._12_4_ < 1) {
    iVar9 = 0;
  }
  else {
    uVar10 = 0;
    iVar8 = 0;
    iVar9 = 0;
    do {
      uVar1 = piVar12[uVar10];
      uVar11 = 0;
      if ((uVar1 & 1) == 0) {
        uVar11 = uVar1;
      }
      iVar9 = iVar9 + uVar11;
      iVar8 = iVar8 + (-(uVar1 & 1) & uVar1);
      uVar10 = uVar10 + 1;
    } while ((uint)prompt.field_2._12_4_ != uVar10);
    iVar9 = iVar9 - iVar8;
  }
  *(undefined8 *)((long)aiStack_248 + lVar3 + -8) = 0x102593;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"The difference of the even numbers and odd numbers is: ",0x37);
  *(undefined8 *)((long)aiStack_248 + lVar3 + -8) = 0x1025a1;
  plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar9);
  uVar2 = *(undefined8 *)(*plVar7 + -0x18);
  *(undefined8 *)((long)aiStack_248 + lVar3 + -8) = 0x1025b8;
  std::ios::widen((char)uVar2 + (char)plVar7);
  *(undefined8 *)((long)aiStack_248 + lVar3 + -8) = 0x1025c3;
  std::ostream::put((char)plVar7);
  *(undefined8 *)((long)aiStack_248 + lVar3 + -8) = 0x1025cb;
  std::ostream::flush();
  uVar2 = prompt_1.field_2._8_8_;
  if ((size_type *)prompt_1.field_2._8_8_ != &prompt._M_string_length) {
    *(undefined8 *)((long)piVar13 + -8) = 0x1025e3;
    operator_delete((void *)uVar2,prompt._M_string_length + 1);
  }
  return 0;
}

Assistant:

int main()
{
    int size;

    string prompt = "Please enter an array size: ";
    getInt(&size, prompt);

    int calcArray [size];
    for(int x = 0; x < size; x++)
    {
        //let's use a stream to combine a string and an int
        string prompt = "Please enter the value of element ";
        ostringstream promptStream;
        promptStream << prompt << x << ": ";

        // this function places the string value into our array
        getInt(&calcArray[x], promptStream.str());

    }

    //blah blah... long function name.... wheeeeeeeeee
    int difference = calculateEvenOddDifference(calcArray, size);

    cout << "The difference of the even numbers and odd numbers is: " << difference << endl;

    return 0;
}